

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LazyJSONString.cpp
# Opt level: O2

Var __thiscall Js::LazyJSONString::TryParse(LazyJSONString *this)

{
  JSONProperty *prop;
  bool bVar1;
  Var pvVar2;
  
  prop = (this->jsonContent).ptr;
  if (prop != (JSONProperty *)0x0) {
    bVar1 = HasComplexGap(this);
    if (!bVar1) {
      pvVar2 = ReconstructVar(this,prop);
      return pvVar2;
    }
  }
  return (Var)0x0;
}

Assistant:

Var
LazyJSONString::TryParse() const
{
    // If we have thrown away our metadata, we won't be able to Parse
    if (this->jsonContent == nullptr)
    {
        return nullptr;
    }

    // If the gap is complex, this means that parse will be a non-trivial transformation,
    // so fall back to the real parse
    if (this->HasComplexGap())
    {
        return nullptr;
    }

    Var result = ReconstructVar(this->jsonContent);

    return result;
}